

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * moria_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool _Var1;
  ushort uVar2;
  loc_conflict to_avoid;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  int iVar6;
  wchar_t down_count;
  wchar_t up_count;
  uint32_t local_b0;
  uint32_t local_ac;
  int local_a8;
  wchar_t local_8c;
  wchar_t local_84;
  wchar_t local_74;
  wchar_t local_70;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t local_60;
  chunk_conflict *c;
  wchar_t x_size;
  wchar_t y_size;
  wchar_t size_percent;
  wchar_t k;
  wchar_t i;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  uVar5 = Rand_div(10);
  iVar6 = uVar5 + 1 + (int)p->depth / 0x18;
  if ((dun->quest & 1U) == 0) {
    if (iVar6 < 2) {
      x_size = L'K';
    }
    else if (iVar6 < 3) {
      x_size = L'P';
    }
    else if (iVar6 < 4) {
      x_size = L'U';
    }
    else if (iVar6 < 5) {
      x_size = L'Z';
    }
    else if (iVar6 < 6) {
      x_size = L'_';
    }
    else {
      x_size = L'd';
    }
  }
  else {
    x_size = L'd';
  }
  uVar2 = z_info->dungeon_hgt;
  uVar5 = Rand_div(10);
  local_68 = ((uint)uVar2 * (x_size + L'\xfffffffb' + uVar5)) / 100;
  uVar2 = z_info->dungeon_wid;
  uVar5 = Rand_div(10);
  local_74 = ((uint)uVar2 * (x_size + L'\xfffffffb' + uVar5)) / 100;
  local_60 = local_68;
  if (local_68 < min_height) {
    local_60 = min_height;
  }
  if ((int)(uint)z_info->dungeon_hgt < local_60) {
    local_64 = (wchar_t)z_info->dungeon_hgt;
  }
  else {
    if (local_68 < min_height) {
      local_68 = min_height;
    }
    local_64 = local_68;
  }
  local_6c = local_74;
  if (local_74 < min_width) {
    local_6c = min_width;
  }
  if ((int)(uint)z_info->dungeon_wid < local_6c) {
    local_70 = (wchar_t)z_info->dungeon_wid;
  }
  else {
    if (local_74 < min_width) {
      local_74 = min_width;
    }
    local_70 = local_74;
  }
  dun->block_hgt = dun->profile->block_size;
  dun->block_wid = dun->profile->block_size;
  if (local_64 < (int)(uint)z_info->dungeon_hgt) {
    local_84 = local_64;
  }
  else {
    local_84 = (wchar_t)z_info->dungeon_hgt;
  }
  if (local_70 < (int)(uint)z_info->dungeon_wid) {
    local_8c = local_70;
  }
  else {
    local_8c = (wchar_t)z_info->dungeon_wid;
  }
  p_local = (player *)moria_chunk(p,(int)p->depth,local_84,local_8c,(_Bool)(dun->persist & 1));
  if (p_local == (player *)0x0) {
    *p_error = "moria chunk could not be created";
    p_local = (player *)0x0;
  }
  else {
    draw_rectangle((chunk_conflict *)p_local,L'\0',L'\0',
                   *(wchar_t *)&p_local->hitdie + L'\xffffffff',
                   *(wchar_t *)&p_local->ht + L'\xffffffff',L'\x16',L'\0',true);
    for (size_percent = L'\0'; size_percent < (dun->profile->str).mag;
        size_percent = size_percent + L'\x01') {
      build_streamer((chunk_conflict *)p_local,L'\x11',(dun->profile->str).mc);
    }
    for (size_percent = L'\0'; size_percent < (dun->profile->str).qua;
        size_percent = size_percent + L'\x01') {
      build_streamer((chunk_conflict *)p_local,L'\x12',(dun->profile->str).qc);
    }
    _Var3 = dun->persist;
    _Var1 = dun->quest;
    down_count = rand_range(3,4);
    up_count = rand_range(1,2);
    handle_level_stairs((chunk_conflict *)p_local,(_Bool)(_Var3 & 1),(_Bool)(_Var1 & 1),down_count,
                        up_count);
    if (*(wchar_t *)((long)&p_local->class + 4) / 3 < 0xb) {
      local_a8 = *(wchar_t *)((long)&p_local->class + 4) / 3;
    }
    else {
      local_a8 = 10;
    }
    if (local_a8 < 2) {
      local_ac = 2;
    }
    else {
      if (*(wchar_t *)((long)&p_local->class + 4) / 3 < 0xb) {
        local_b0 = *(wchar_t *)((long)&p_local->class + 4) / 3;
      }
      else {
        local_b0 = 10;
      }
      local_ac = local_b0;
    }
    uVar5 = Rand_div(local_ac);
    alloc_objects((chunk_conflict *)p_local,L'\x01',L'\0',uVar5 + L'\x01',
                  *(wchar_t *)((long)&p_local->class + 4),'\0');
    uVar5 = Rand_div(local_ac);
    alloc_objects((chunk_conflict *)p_local,L'\x01',L'\x01',(int)(uVar5 + 1) / 5,
                  *(wchar_t *)((long)&p_local->class + 4),'\0');
    _Var3 = new_player_spot((chunk_conflict *)p_local,p);
    if (_Var3) {
      uVar2 = z_info->level_monster_min;
      uVar5 = Rand_div(8);
      size_percent = (uint)uVar2 + uVar5 + 1 + local_ac;
      mon_restrict("Moria dwellers",*(wchar_t *)((long)&p_local->class + 4),
                   *(wchar_t *)((long)&p_local->class + 4),true);
      for (; L'\0' < size_percent; size_percent = size_percent + L'\xffffffff') {
        to_avoid.x = (p->grid).x;
        to_avoid.y = (p->grid).y;
        pick_and_place_distant_monster
                  ((chunk *)p_local,to_avoid,L'\0',true,*(wchar_t *)((long)&p_local->class + 4));
      }
      mon_restrict((char *)0x0,*(wchar_t *)((long)&p_local->class + 4),
                   *(wchar_t *)((long)&p_local->class + 4),false);
      iVar4 = Rand_normal((uint)z_info->room_item_av,3);
      alloc_objects((chunk_conflict *)p_local,L'\x02',L'\x03',(int)iVar4,
                    *(wchar_t *)((long)&p_local->class + 4),'\x01');
      iVar4 = Rand_normal((uint)z_info->both_item_av,3);
      alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x03',(int)iVar4,
                    *(wchar_t *)((long)&p_local->class + 4),'\x01');
      iVar4 = Rand_normal((uint)z_info->both_gold_av,3);
      alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x02',(int)iVar4,
                    *(wchar_t *)((long)&p_local->class + 4),'\x01');
    }
    else {
      uncreate_artifacts((chunk_conflict *)p_local);
      wipe_mon_list((chunk *)p_local,p);
      cave_free((chunk_conflict *)p_local);
      *p_error = "could not place player";
      p_local = (player *)0x0;
    }
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *moria_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	struct chunk *c;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	c = moria_chunk(p, p->depth, MIN(z_info->dungeon_hgt, y_size),
		MIN(z_info->dungeon_wid, x_size), dun->persist);
	if (!c) {
		*p_error = "moria chunk could not be created";
		return NULL;
	}

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Moria levels have a high proportion of cave dwellers. */
	mon_restrict("Moria dwellers", c->depth, c->depth, true);

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, c->depth, c->depth, false);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}